

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O3

Error __thiscall asmjit::X86RAPass::translate(X86RAPass *this)

{
  CBNode **ppCVar1;
  uint32_t *puVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  long *plVar6;
  void *pvVar7;
  RegOrder RVar8;
  CBNode *node_00;
  uint uVar18;
  char extraout_AL;
  int iVar9;
  Error EVar10;
  undefined4 extraout_var;
  ulong uVar11;
  undefined1 *puVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CCFunc *pCVar13;
  CBNode *pCVar14;
  CodeCompiler *node_01;
  long lVar15;
  char *in_RCX;
  uint32_t typeId;
  long extraout_RDX;
  CCFunc *unaff_RBP;
  CCFunc *pCVar16;
  CCFunc *in_RSI;
  CCFunc *pCVar17;
  CCFunc *node_02;
  CodeCompiler *this_00;
  uint *this_01;
  long lVar19;
  CodeBuilder *pCVar20;
  ulong in_R8;
  uint uVar21;
  ulong in_R9;
  CCFunc *vreg;
  CBLabel *node;
  CCFunc *pCVar22;
  CodeBuilder *pCVar23;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar24;
  X86Mem m;
  X86CallAlloc cAlloc;
  X86VarAlloc vAlloc;
  __va_list_tag _Stack_298;
  undefined1 auStack_278 [32];
  ulong uStack_258;
  ulong uStack_250;
  undefined8 uStack_238;
  X86RAPass *pXStack_1c8;
  CBNode *pCStack_1c0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_1b8;
  X86RAPass *pXStack_1a8;
  CCFunc *pCStack_1a0;
  CCFunc *pCStack_198;
  CCFunc *pCStack_190;
  CodeBuilder *pCStack_188;
  CCFunc *pCStack_180;
  CCFunc *local_170;
  CBLabel *local_168;
  CCFunc *local_160;
  CBLabel *local_158;
  X86RAPass *local_150;
  CCFunc *local_148;
  CodeBuilder *local_140;
  undefined1 *local_138;
  anon_union_16_7_ed616b9d_for_Operand__0 local_130;
  int32_t local_114;
  int local_10c;
  X86CallAlloc local_f0;
  X86RAPass *local_90;
  CodeBuilder *local_88;
  
  pCVar20 = (this->super_RAPass).super_CBPass._cb;
  local_160 = (this->super_RAPass)._func;
  pCVar13 = (CCFunc *)(this->super_RAPass)._stop;
  pCVar22 = (CCFunc *)(this->super_RAPass)._jccList._first;
  node_02 = local_160;
  local_170 = pCVar13;
  local_f0.super_X86BaseAlloc._context = this;
  local_f0.super_X86BaseAlloc._cc = (X86Compiler *)pCVar20;
  local_90 = this;
  local_88 = pCVar20;
LAB_00130257:
  uVar5 = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._flags;
  if ((uVar5 & 1) == 0) goto LAB_0013028d;
  vreg = pCVar13;
  pCVar23 = pCVar20;
  if ((((CBInst *)&node_02->super_CBLabel)->super_CBNode)._type != '\x04')
  goto switchD_001302c7_caseD_7;
  pCVar20->_cursor = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._prev;
  in_RSI = *(CCFunc **)((long)(((CBInst *)&node_02->super_CBLabel)->super_CBNode)._passData + 8);
LAB_0013027f:
  pCStack_180 = (CCFunc *)0x130288;
  (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this);
  vreg = pCVar13;
  pCVar23 = pCVar20;
switchD_001302c7_caseD_7:
  pCVar13 = pCVar22;
  do {
    if (pCVar13 == (CCFunc *)0x0) {
      pCStack_180 = (CCFunc *)0x130721;
      this_01 = (uint *)this;
      EVar10 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[10])();
      pCVar22 = local_160;
      if (EVar10 != 0) {
        return EVar10;
      }
      (local_160->_frameInfo)._dirtyRegs[0] = (uint)(this->_clobberedRegs).field_0.field_0._gp;
      (local_160->_frameInfo)._dirtyRegs[2] = (uint)(this->_clobberedRegs).field_0.field_0._mm;
      (local_160->_frameInfo)._dirtyRegs[3] = (uint)(this->_clobberedRegs).field_0.field_0._k;
      (local_160->_frameInfo)._dirtyRegs[1] = (this->_clobberedRegs).field_0.field_0._vec;
      (local_160->_frameInfo)._stackFrameSize = (this->super_RAPass)._memAllTotal;
      uVar18 = (this->super_RAPass)._memMaxAlign;
      if (0xff < uVar18) goto LAB_001308f2;
      (local_160->_frameInfo)._stackFrameAlignment = (uint8_t)uVar18;
      pCStack_180 = (CCFunc *)0x13079f;
      EVar10 = FuncFrameLayout::init
                         ((FuncFrameLayout *)&local_130._any,(EVP_PKEY_CTX *)&local_160->_funcDetail
                         );
      if (EVar10 != 0) {
        return EVar10;
      }
      this->_varBaseRegId = local_130._any.signature._1_1_;
      this->_varBaseOffset = local_114;
      pCVar20 = (this->super_RAPass).super_CBPass._cb;
      in_RCX = (char *)0xf8;
      pCVar13 = pCVar22;
      goto LAB_001307c7;
    }
    pCVar22 = (CCFunc *)(((CBInst *)&pCVar13->super_CBLabel)->super_CBNode)._prev;
    unaff_RBP = (CCFunc *)(((CBInst *)&pCVar13->super_CBLabel)->super_CBNode)._next;
    uVar11 = (ulong)(((((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._flags & 0x40) == 0);
    in_RCX = (char *)(uVar11 * 0x40);
    node_02 = *(CCFunc **)
               ((long)&((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode + uVar11 * 0x40 + 8);
    in_RSI = *(CCFunc **)((long)(((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._passData + 8)
    ;
    pCStack_180 = (CCFunc *)0x1306e6;
    (*(this->super_RAPass).super_CBPass._vptr_CBPass[6])(this);
    pvVar7 = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._passData;
    if ((pvVar7 == (void *)0x0) || (*(long *)((long)pvVar7 + 8) == 0)) break;
    pCStack_180 = (CCFunc *)0x130704;
    in_RSI = unaff_RBP;
    X86RAPass_translateJump(this,(CBJump *)unaff_RBP,&node_02->super_CBLabel);
    pCVar13 = pCVar22;
  } while (((((CBInst *)&node_02->super_CBLabel)->super_CBNode)._flags & 1) != 0);
  uVar5 = (((CBInst *)&node_02->super_CBLabel)->super_CBNode)._flags;
  pCVar13 = vreg;
  pCVar20 = pCVar23;
LAB_0013028d:
  pCVar16 = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
  pvVar7 = (node_02->super_CBLabel).super_CBNode._passData;
  in_RCX = (char *)(ulong)(uVar5 | 1);
  (node_02->super_CBLabel).super_CBNode._flags = (uint16_t)(uVar5 | 1);
  unaff_RBP = pCVar16;
  if (pvVar7 != (void *)0x0) {
    bVar4 = (node_02->super_CBLabel).super_CBNode._type;
    in_RCX = (char *)(ulong)bVar4;
    pCVar17 = (CCFunc *)(ulong)(bVar4 - 1);
    in_RSI = pCVar17;
    if (0x13 < bVar4 - 1) goto switchD_001302c7_caseD_1;
    goto switchD_0012aca3_caseD_1302b9;
  }
  goto switchD_001302c7_caseD_1;
LAB_001307c7:
  if (((((CBInst *)&pCVar13->super_CBLabel)->super_CBNode)._type == '\x01') &&
     (bVar4 = ((CBInst *)&pCVar13->super_CBLabel)->_memOpIndex, bVar4 != 0xff)) {
    RVar8 = (pCVar13->_funcDetail)._callConv._passedOrder[0];
    lVar15 = (ulong)bVar4 * 0x10;
    in_RSI = (CCFunc *)((long)RVar8 + lVar15);
    uVar18 = *(uint *)((long)RVar8 + lVar15);
    if ((uVar18 >> 0xe & 1) != 0) {
      ppCVar1 = &(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next;
      *(int *)ppCVar1 = *(int *)ppCVar1 + local_10c;
      uVar18 = uVar18 & 0xffffbfff;
      *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev = uVar18;
    }
    this_01 = (uint *)(ulong)uVar18;
    if ((short)uVar18 < 0) {
      uVar21 = *(uint *)((long)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next + 4);
      in_R8 = (ulong)uVar21;
      if (0xff < uVar21) {
        if (uVar21 == 0xffffffff) {
LAB_001308f7:
          pCStack_180 = (CCFunc *)0x1308fc;
          translate();
LAB_001308fc:
          pCStack_180 = (CCFunc *)0x130901;
          translate();
LAB_00130901:
          pCStack_180 = (CCFunc *)0x130906;
          translate();
LAB_00130906:
          pCStack_180 = (CCFunc *)0x13090b;
          translate();
          pCVar16 = unaff_RBP;
          unaff_RBP = vreg;
          pCVar20 = pCVar23;
LAB_0013090b:
          pCStack_180 = (CCFunc *)0x130910;
          translate();
LAB_00130910:
          pCStack_180 = (CCFunc *)0x130915;
          translate();
LAB_00130915:
          pCStack_180 = (CCFunc *)X86RAPass_translateJump;
          translate();
          pCVar23 = (((X86RAPass *)this_01)->super_RAPass).super_CBPass._cb;
          node_00 = (((((X86RAPass *)this_01)->super_RAPass)._func)->_end->super_CBNode)._prev;
          pXStack_1c8 = (X86RAPass *)0x130951;
          pXStack_1a8 = this;
          pCStack_1a0 = unaff_RBP;
          pCStack_198 = node_02;
          pCStack_190 = pCVar22;
          pCStack_188 = pCVar20;
          pCStack_180 = pCVar16;
          pCVar14 = CodeBuilder::setCursor(pCVar23,node_00);
          pXStack_1c8 = (X86RAPass *)0x130966;
          (*(code *)(((X86RAPass *)(((X86RAPass *)this_01)->super_RAPass).super_CBPass._vptr_CBPass)
                    ->super_RAPass)._heap._slots[3])
                    (this_01,*(undefined8 *)(*(long *)(extraout_RDX + 0x20) + 8));
          if (pCVar23->_cursor != node_00) {
            pXStack_1c8 = (X86RAPass *)0x13097f;
            uVar24 = extraout_XMM1_Qa;
            pCStack_1c0 = pCVar14;
            node_01 = (CodeCompiler *)CodeBuilder::newLabelNode(pCVar23);
            aStack_1b8._packed[0] = (UInt64)((ulong)*(uint *)(extraout_RDX + 0x28) << 0x20 | 4);
            aStack_1b8._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
            pXStack_1c8 = (X86RAPass *)0x1309ac;
            CodeEmitter::emit(&pCVar23->super_CodeEmitter,0x11e,(Operand_ *)&aStack_1b8._any);
            pCVar23->_cursor = node_00;
            pXStack_1c8 = (X86RAPass *)0x1309be;
            this_00 = node_01;
            pCVar20 = pCVar23;
            CodeBuilder::addNode(pCVar23,(CBNode *)node_01);
            bVar4 = (((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._opCount;
            if (bVar4 == 0) {
              pXStack_1c8 = (X86RAPass *)X86Compiler::newReg;
              X86RAPass_translateJump();
              _Stack_298.reg_save_area = auStack_278;
              if (extraout_AL != '\0') {
                uStack_238 = uVar24;
              }
              _Stack_298.overflow_arg_area = &aStack_1b8;
              _Stack_298.gp_offset = 0x20;
              _Stack_298.fp_offset = 0x30;
              uStack_258 = in_R8;
              uStack_250 = in_R9;
              pXStack_1c8 = (X86RAPass *)this_01;
              CodeCompiler::_newReg(this_00,(Reg *)pCVar20,typeId,in_RCX,&_Stack_298);
              return (Error)pCVar20;
            }
            uVar18._0_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._type;
            uVar18._1_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._destroyed;
            uVar18._2_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._finalized;
            uVar18._3_1_ = (node_01->super_CodeBuilder).super_CodeEmitter._reserved;
            RVar8 = (in_RSI->_funcDetail)._callConv._passedOrder[0];
            lVar15 = (ulong)(bVar4 - 1) * 0x10;
            *(ulong *)((long)RVar8 + lVar15) = (ulong)uVar18 << 0x20 | 4;
            *(undefined8 *)((long)RVar8 + 8 + lVar15) = 0;
            *(CodeCompiler **)(in_RSI->_funcDetail)._callConv._passedOrder[1].id = node_01;
            puVar2 = &((CBInst *)&in_RSI->super_CBLabel)->_options;
            *(byte *)puVar2 = (byte)*puVar2 & 0xbf;
            pCVar14 = pCStack_1c0;
          }
          pCVar23->_cursor = pCVar14;
          pXStack_1c8 = (X86RAPass *)0x130a10;
          EVar10 = (*(code *)(((X86RAPass *)
                              (((X86RAPass *)this_01)->super_RAPass).super_CBPass._vptr_CBPass)->
                             super_RAPass)._heap._slots[1])
                             (this_01,*(undefined8 *)
                                       ((long)(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode).
                                              _passData + 8));
          return EVar10;
        }
        in_R8 = (ulong)(uVar21 - 0x100);
        uVar11._0_4_ = pCVar20[1].super_CodeEmitter._privateData;
        uVar11._4_4_ = pCVar20[1].super_CodeEmitter._globalHints;
        if (uVar11 <= in_R8) goto LAB_001308fc;
        in_R9 = *(ulong *)&pCVar20[1].super_CodeEmitter._type;
        in_R8 = *(ulong *)(in_R9 + in_R8 * 8);
        if (in_R8 == 0) goto LAB_00130901;
        in_R8 = *(ulong *)(in_R8 + 0x28);
        if (in_R8 == 0) goto LAB_00130906;
        uVar21 = (pCVar20->super_CodeEmitter)._nativeGpReg.super_Operand.super_Operand_.field_0._any
                 .signature & 0xf8;
        in_R9 = (ulong)uVar21;
        bVar4 = this->_varBaseRegId;
        *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev =
             uVar18 & 0xffffff07 | uVar21;
        *(uint *)((long)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next + 4) = (uint)bVar4
        ;
        ppCVar1 = &(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._next;
        *(int *)ppCVar1 = *(int *)ppCVar1 + *(int *)(in_R8 + 8) + this->_varBaseOffset;
        *(uint *)&(((CBInst *)&in_RSI->super_CBLabel)->super_CBNode)._prev =
             uVar18 & 0xffff7f07 | uVar21;
      }
    }
  }
  pCVar13 = (CCFunc *)(((CBInst *)&pCVar13->super_CBLabel)->super_CBNode)._next;
  if (pCVar13 == vreg) {
    pCVar23->_cursor = (CBNode *)pCVar22;
    pCStack_180 = (CCFunc *)0x1308b4;
    EVar10 = FuncUtils::emitProlog
                       (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                        (FuncFrameLayout *)&local_130._any);
    if (EVar10 == 0) {
      pCVar23->_cursor = &pCVar22->_exitNode->super_CBNode;
      pCStack_180 = (CCFunc *)0x1308d4;
      EVar10 = FuncUtils::emitEpilog
                         (&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,
                          (FuncFrameLayout *)&local_130._any);
    }
    return EVar10;
  }
  goto LAB_001307c7;
switchD_0012aca3_caseD_1302b9:
  this_01 = &switchD_001302c7::switchdataD_00140468;
  in_RSI = (CCFunc *)
           ((long)&switchD_001302c7::switchdataD_00140468 +
           (long)(int)(&switchD_001302c7::switchdataD_00140468)[(long)pCVar17]);
  vreg = pCVar13;
  pCVar23 = pCVar20;
  switch(pCVar17) {
  case (CCFunc *)0x0:
  case (CCFunc *)0xf:
  case (CCFunc *)0x11:
  case (CCFunc *)0x12:
    if (((((uVar5 & 0x20) == 0) && (pCVar16 != (CCFunc *)0x0)) &&
        (plVar6 = (long *)(((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._passData,
        plVar6 != (long *)0x0)) &&
       ((lVar15 = *plVar6, lVar15 != 0 &&
        (uVar18 = *(uint *)((long)pvVar7 + 0x10), (ulong)uVar18 != 0)))) {
      lVar19 = 0;
      do {
        in_R8 = *(ulong *)((long)pvVar7 + lVar19 + 0x38);
        in_R9 = (ulong)*(uint *)(in_R8 + 0x18);
        if (((*(ulong *)(lVar15 + (ulong)(*(uint *)(in_R8 + 0x18) >> 6) * 8) >> (in_R9 & 0x3f) & 1)
             == 0) && ((*(byte *)(in_R8 + 0x17) & 1) == 0)) {
          pbVar3 = (byte *)((long)pvVar7 + lVar19 + 0x41);
          *pbVar3 = *pbVar3 | 0x10;
        }
        lVar19 = lVar19 + 0x18;
      } while ((ulong)uVar18 * 0x18 != lVar19);
    }
    if (bVar4 == 0x12) {
      pCStack_180 = (CCFunc *)0x13033a;
      X86CallAlloc::run(&local_f0,(CCFuncCall *)node_02);
      in_RSI = node_02;
      break;
    }
  case (CCFunc *)0x10:
  case (CCFunc *)0x13:
    this_01 = (uint *)&stack0xffffffffffffff70;
    pCStack_180 = (CCFunc *)0x13034f;
    in_RSI = node_02;
    X86VarAlloc::run((X86VarAlloc *)this_01,(CBNode *)node_02);
    uVar5 = (node_02->super_CBLabel).super_CBNode._flags;
    if ((uVar5 & 0x30) == 0) {
      if ((char)uVar5 < '\0') {
        local_158 = local_160->_exitNode;
        local_150 = (X86RAPass *)(this->super_RAPass).super_CBPass._cb;
        local_168 = (CBLabel *)(node_02->super_CBLabel).super_CBNode._next;
        pCVar23 = (CodeBuilder *)(node_02->super_CBLabel).super_CBNode._passData;
        local_140 = pCVar20;
        local_148 = pCVar16;
        if ((pCVar23 != (CodeBuilder *)0x0) &&
           (uVar11 = (ulong)(uint)(pCVar23->super_CodeEmitter)._codeInfo._baseAddress, uVar11 != 0))
        {
          puVar12 = (undefined1 *)(uVar11 * 0x18);
          unaff_RBP = (CCFunc *)0x0;
          local_138 = puVar12;
          do {
            if (0x3fffffff <
                *(uint *)((long)&(pCVar23->super_CodeEmitter)._inlineComment + (long)unaff_RBP)) {
              vreg = *(CCFunc **)
                      ((long)&(pCVar23->super_CodeEmitter)._globalOptions + (long)unaff_RBP);
              if (*(RACell **)&((CBInst *)&vreg->super_CBLabel)->_instId == (RACell *)0x0) {
                pCStack_180 = (CCFunc *)0x130433;
                in_RSI = vreg;
                this_01 = (uint *)this;
                RAPass::_newVarCell(&this->super_RAPass,(VirtReg *)vreg);
              }
              pCVar13 = local_170;
              local_130._packed[0] =
                   (UInt64)((ulong)((((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter).
                                    _nativeGpReg.super_Operand.super_Operand_.field_0._any.signature
                                   & 0xf8) | 0xffffffff00008002);
              local_130._mem.field_2 =
                   (anon_union_8_2_78723da6_for_MemData_2)
                   ((ulong)*(uint *)&(((CBInst *)&vreg->super_CBLabel)->super_CBNode)._prev << 0x20)
              ;
              in_RCX = (char *)(long)(char)(uint8_t)(((CBInst *)&vreg->super_CBLabel)->super_CBNode)
                                                    ._position;
              if (-1 < (long)in_RCX) {
                if (in_RCX[0x132480] == '*') {
                  in_RCX = (char *)0x4000000;
                }
                else if (in_RCX[0x132480] == '+') {
                  in_RCX = (char *)0x8000000;
                }
                else {
                  in_RCX = (char *)(ulong)((uint)((((undefined1 *)
                                                   ((long)&(pCVar23->super_CodeEmitter).
                                                           _inlineComment + 3))[(long)unaff_RBP] &
                                                  0x40) == 0) * 0x4000000 + 0x4000000);
                }
                uVar18 = local_130._0_4_;
                local_130._any.id = 0xffffffff;
                local_130._any.signature = uVar18 | (uint)in_RCX;
                in_RSI = (CCFunc *)0xc6;
                pCStack_180 = (CCFunc *)0x1304d1;
                this_01 = (uint *)local_150;
                CodeEmitter::emit((CodeEmitter *)local_150,0xc6,(Operand_ *)&local_130._any);
                puVar12 = local_138;
                goto LAB_001304d6;
              }
              pCStack_180 = (CCFunc *)0x1308f2;
              translate();
LAB_001308f2:
              pCStack_180 = (CCFunc *)0x1308f7;
              translate();
              goto LAB_001308f7;
            }
LAB_001304d6:
            unaff_RBP = (CCFunc *)
                        &(((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._inlineComment;
          } while ((CCFunc *)puVar12 != unaff_RBP);
        }
        for (; pCVar20 = local_140, unaff_RBP = local_148, local_168 != (CBLabel *)0x0;
            local_168 = (CBLabel *)(local_168->super_CBNode)._next) {
          bVar4 = (local_168->super_CBNode)._type;
          if (bVar4 < 8) {
            in_RCX = (char *)(ulong)(bVar4 - 1);
            if (bVar4 - 1 < 2) break;
            if (bVar4 == 4) {
              if (local_168 == local_158) goto switchD_001302c7_caseD_1;
              break;
            }
          }
          else {
            in_RCX = (char *)(ulong)(bVar4 - 0x11);
            if (bVar4 - 0x11 < 2) break;
            if (bVar4 == 8) goto switchD_001302c7_caseD_1;
            if (bVar4 == 0x10) {
              return 4;
            }
          }
        }
        (local_150->_x86State).field_0._list[5] = (VirtReg *)node_02;
        local_130._packed[0] = (UInt64)((ulong)local_158->_id << 0x20 | 4);
        local_130._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
        in_RSI = (CCFunc *)0x11e;
        pCStack_180 = (CCFunc *)0x1306a7;
        CodeEmitter::emit((CodeEmitter *)local_150,0x11e,(Operand_ *)&local_130._any);
      }
    }
    else {
      unaff_RBP = *(CCFunc **)(node_02->_funcDetail)._callConv._passedOrder[1].id;
      pCVar13 = local_170;
      if (unaff_RBP == (CCFunc *)0x0) {
        unaff_RBP = pCVar16;
        vreg = local_170;
        if ((uVar5 & 0x10) != 0) goto switchD_001302c7_caseD_7;
      }
      else if ((uVar5 & 0x10) == 0) {
        pCVar16 = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
        uVar5 = (((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._flags;
        if (((((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._flags & 1) == 0) {
          if ((uVar5 & 1) == 0) {
            pCStack_180 = (CCFunc *)0x130392;
            iVar9 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
            in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
            *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var,iVar9);
            pCVar13 = local_170;
            if (((node_02->super_CBLabel).super_CBNode._flags & 0x40) == 0) {
              unaff_RBP = (CCFunc *)(node_02->super_CBLabel).super_CBNode._next;
            }
            else {
              unaff_RBP = *(CCFunc **)(node_02->_funcDetail)._callConv._passedOrder[1].id;
            }
          }
          else {
            if ((((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._type != '\x04')
            goto LAB_00130915;
            pCStack_180 = (CCFunc *)0x130632;
            iVar9 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
            in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
            *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_02,iVar9);
            pCVar20->_cursor = (CBNode *)node_02;
            in_RSI = *(CCFunc **)
                      ((long)(((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._passData + 8);
            pCStack_180 = (CCFunc *)0x130652;
            (*(this->super_RAPass).super_CBPass._vptr_CBPass[8])(this);
            pCVar13 = local_170;
          }
        }
        else {
          if ((uVar5 & 1) != 0) {
            if ((((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._type != '\x04')
            goto LAB_00130910;
            pCVar20->_cursor = (node_02->super_CBLabel).super_CBNode._prev;
            pCStack_180 = (CCFunc *)0x1305fe;
            (*(this->super_RAPass).super_CBPass._vptr_CBPass[9])
                      (this,*(undefined8 *)
                             ((long)(((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._passData
                             + 8),
                       *(undefined8 *)
                        ((long)(((CBInst *)&pCVar16->super_CBLabel)->super_CBNode)._passData + 8));
          }
          pCStack_180 = (CCFunc *)0x130607;
          iVar9 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
          in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
          *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_01,iVar9);
          pCStack_180 = (CCFunc *)0x13061d;
          X86RAPass_translateJump(this,(CBJump *)node_02,&unaff_RBP->super_CBLabel);
          unaff_RBP = pCVar16;
          in_RSI = node_02;
          pCVar13 = local_170;
        }
      }
      else {
        pvVar7 = (((CBInst *)&unaff_RBP->super_CBLabel)->super_CBNode)._passData;
        if ((pvVar7 != (void *)0x0) &&
           (in_RSI = *(CCFunc **)((long)pvVar7 + 8), in_RSI != (CCFunc *)0x0))
        goto code_r0x001305bb;
      }
    }
    break;
  case (CCFunc *)0x3:
    unaff_RBP = pCVar13;
    if (*(long *)((long)pvVar7 + 8) != 0) goto LAB_0013090b;
    pCStack_180 = (CCFunc *)0x130567;
    iVar9 = (*(this->super_RAPass).super_CBPass._vptr_CBPass[7])(this);
    in_RCX = (char *)(node_02->super_CBLabel).super_CBNode._passData;
    *(ulong *)(in_RCX + 8) = CONCAT44(extraout_var_00,iVar9);
    unaff_RBP = pCVar16;
    if (node_02 == (CCFunc *)local_160->_exitNode) goto switchD_001302c7_caseD_7;
    break;
  case (CCFunc *)0x7:
    goto switchD_001302c7_caseD_7;
  }
switchD_001302c7_caseD_1:
  vreg = pCVar13;
  node_02 = unaff_RBP;
  pCVar23 = pCVar20;
  if (unaff_RBP != pCVar13) goto LAB_00130257;
  goto switchD_001302c7_caseD_7;
code_r0x001305bb:
  pCVar20->_cursor = (node_02->super_CBLabel).super_CBNode._prev;
  goto LAB_0013027f;
}

Assistant:

Error X86RAPass::translate() {
  X86Compiler* cc = this->cc();
  CCFunc* func = getFunc();

  // Register allocator contexts.
  X86VarAlloc vAlloc(this);
  X86CallAlloc cAlloc(this);

  // Flow.
  CBNode* node_ = func;
  CBNode* next = nullptr;
  CBNode* stop = getStop();

  ZoneList<CBNode*>::Link* jLink = _jccList.getFirst();

  for (;;) {
    while (node_->isTranslated()) {
      // Switch state if we went to a node that is already translated.
      if (node_->getType() == CBNode::kNodeLabel) {
        CBLabel* node = static_cast<CBLabel*>(node_);
        cc->_setCursor(node->getPrev());
        switchState(node->getPassData<RAData>()->state);
      }

_NextGroup:
      if (!jLink) {
        goto _Done;
      }
      else {
        node_ = jLink->getValue();
        jLink = jLink->getNext();

        CBNode* jFlow = X86RAPass_getOppositeJccFlow(static_cast<CBJump*>(node_));
        loadState(node_->getPassData<RAData>()->state);

        if (jFlow->hasPassData() && jFlow->getPassData<RAData>()->state) {
          X86RAPass_translateJump(this, static_cast<CBJump*>(node_), static_cast<CBLabel*>(jFlow));

          node_ = jFlow;
          if (node_->isTranslated())
            goto _NextGroup;
        }
        else {
          node_ = jFlow;
        }

        break;
      }
    }

    next = node_->getNext();
    node_->_flags |= CBNode::kFlagIsTranslated;

    if (node_->hasPassData()) {
      switch (node_->getType()) {
        // --------------------------------------------------------------------
        // [Align / Embed]
        // --------------------------------------------------------------------

        case CBNode::kNodeAlign:
        case CBNode::kNodeData:
          break;

        // --------------------------------------------------------------------
        // [Label]
        // --------------------------------------------------------------------

        case CBNode::kNodeLabel: {
          CBLabel* node = static_cast<CBLabel*>(node_);
          ASMJIT_ASSERT(node->getPassData<RAData>()->state == nullptr);
          node->getPassData<RAData>()->state = saveState();

          if (node == func->getExitNode())
            goto _NextGroup;
          break;
        }

        // --------------------------------------------------------------------
        // [Inst/Call/SArg/Ret]
        // --------------------------------------------------------------------

        case CBNode::kNodeInst:
        case CBNode::kNodeFunc:
        case CBNode::kNodeFuncCall:
        case CBNode::kNodePushArg:
          // Update TiedReg's unuse flags based on liveness of the next node.
          if (!node_->isJcc()) {
            X86RAData* raData = node_->getPassData<X86RAData>();
            RABits* liveness;

            if (raData && next && next->hasPassData() && (liveness = next->getPassData<RAData>()->liveness)) {
              TiedReg* tiedArray = raData->tiedArray;
              uint32_t tiedTotal = raData->tiedTotal;

              for (uint32_t i = 0; i < tiedTotal; i++) {
                TiedReg* tied = &tiedArray[i];
                VirtReg* vreg = tied->vreg;

                if (!liveness->getBit(vreg->_raId) && !vreg->isFixed())
                  tied->flags |= TiedReg::kUnuse;
              }
            }
          }

          if (node_->getType() == CBNode::kNodeFuncCall) {
            ASMJIT_PROPAGATE(cAlloc.run(static_cast<CCFuncCall*>(node_)));
            break;
          }
          ASMJIT_FALLTHROUGH;

        case CBNode::kNodeHint:
        case CBNode::kNodeFuncExit: {
          ASMJIT_PROPAGATE(vAlloc.run(node_));

          // Handle conditional/unconditional jump.
          if (node_->isJmpOrJcc()) {
            CBJump* node = static_cast<CBJump*>(node_);
            CBLabel* jTarget = node->getTarget();

            // Target not followed.
            if (!jTarget) {
              if (node->isJmp())
                goto _NextGroup;
              else
                break;
            }

            if (node->isJmp()) {
              if (jTarget->hasPassData() && jTarget->getPassData<RAData>()->state) {
                cc->_setCursor(node->getPrev());
                switchState(jTarget->getPassData<RAData>()->state);

                goto _NextGroup;
              }
              else {
                next = jTarget;
              }
            }
            else {
              CBNode* jNext = node->getNext();

              if (jTarget->isTranslated()) {
                if (jNext->isTranslated()) {
                  ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);
                  cc->_setCursor(node->getPrev());
                  intersectStates(
                    jTarget->getPassData<RAData>()->state,
                    jNext->getPassData<RAData>()->state);
                }

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                X86RAPass_translateJump(this, node, jTarget);
                next = jNext;
              }
              else if (jNext->isTranslated()) {
                ASMJIT_ASSERT(jNext->getType() == CBNode::kNodeLabel);

                RAState* savedState = saveState();
                node->getPassData<RAData>()->state = savedState;

                cc->_setCursor(node);
                switchState(jNext->getPassData<RAData>()->state);
                next = jTarget;
              }
              else {
                node->getPassData<RAData>()->state = saveState();
                next = X86RAPass_getJccFlow(node);
              }
            }
          }
          else if (node_->isRet()) {
            ASMJIT_PROPAGATE(
              X86RAPass_translateRet(this, static_cast<CCFuncRet*>(node_), func->getExitNode()));
          }
          break;
        }

        // --------------------------------------------------------------------
        // [End]
        // --------------------------------------------------------------------

        case CBNode::kNodeSentinel: {
          goto _NextGroup;
        }

        default:
          break;
      }
    }

    if (next == stop)
      goto _NextGroup;
    node_ = next;
  }

_Done:
  {
    ASMJIT_PROPAGATE(resolveCellOffsets());
    ASMJIT_PROPAGATE(X86RAPass_prepareFuncFrame(this, func));

    FuncFrameLayout layout;
    ASMJIT_PROPAGATE(layout.init(func->getDetail(), func->getFrameInfo()));

    _varBaseRegId = layout._stackBaseRegId;
    _varBaseOffset = layout._stackBaseOffset;

    ASMJIT_PROPAGATE(X86RAPass_patchFuncMem(this, func, stop, layout));

    cc->_setCursor(func);
    ASMJIT_PROPAGATE(FuncUtils::emitProlog(this->cc(), layout));

    cc->_setCursor(func->getExitNode());
    ASMJIT_PROPAGATE(FuncUtils::emitEpilog(this->cc(), layout));
  }

  return kErrorOk;
}